

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FBmTexture *
pbrt::FBmTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  Allocator alloc_00;
  int iVar1;
  FBmTexture *pFVar2;
  TextureParameterDictionary *in_RSI;
  Float FVar3;
  TextureMapping3DHandle map;
  string *in_stack_ffffffffffffff28;
  TextureParameterDictionary *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  TextureMapping3DHandle *args;
  undefined4 in_stack_ffffffffffffff50;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_59;
  string local_58 [8];
  FileLoc *in_stack_ffffffffffffffb0;
  Transform *in_stack_ffffffffffffffb8;
  ParameterDictionary *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  TextureParameterDictionary::operator_cast_to_ParameterDictionary_(in_RSI);
  alloc_00.memoryResource._4_4_ = in_stack_ffffffffffffffcc;
  alloc_00.memoryResource._0_4_ = in_stack_ffffffffffffffc8;
  TextureMapping3DHandle::Create
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,alloc_00)
  ;
  __a = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
  iVar1 = TextureParameterDictionary::GetOneInt
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
  args = (TextureMapping3DHandle *)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
  FVar3 = TextureParameterDictionary::GetOneFloat
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0.0);
  pFVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::FBmTexture,pbrt::TextureMapping3DHandle&,int,float>
                     ((polymorphic_allocator<std::byte> *)CONCAT44(iVar1,in_stack_ffffffffffffff50),
                      args,(int *)in_RSI,(float *)CONCAT44(FVar3,in_stack_ffffffffffffff38));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  return pFVar2;
}

Assistant:

FBmTexture *FBmTexture::Create(const Transform &renderFromTexture,
                               const TextureParameterDictionary &parameters,
                               const FileLoc *loc, Allocator alloc) {
    // Initialize 3D texture mapping _map_ from _tp_
    TextureMapping3DHandle map =
        TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
    return alloc.new_object<FBmTexture>(map, parameters.GetOneInt("octaves", 8),
                                        parameters.GetOneFloat("roughness", .5f));
}